

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll_test.cc
# Opt level: O0

void __thiscall
vw_dll_parsed_and_constructed_example_parity::test_method
          (vw_dll_parsed_and_constructed_example_parity *this)

{
  undefined8 uVar1;
  bool bVar2;
  dense_parameters *pdVar3;
  dense_parameters *second_00;
  undefined8 uVar4;
  sparse_parameters *in_stack_00000018;
  sparse_parameters *in_stack_00000020;
  vw *vw2;
  vw *vw1;
  float score_constructed;
  float score_parsed;
  size_t thash;
  VW_FEATURE_SPACE second;
  size_t shash;
  VW_FEATURE_SPACE first;
  VW_FEATURE_SPACE fs;
  VW_EXAMPLE example_constructed;
  VW_HANDLE handle2;
  VW_EXAMPLE example_parsed;
  VW_HANDLE handle1;
  basic_cstring<const_char> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  basic_cstring<const_char> local_128;
  undefined1 local_118 [40];
  undefined1 local_f0 [16];
  basic_cstring<const_char> local_e0;
  long local_d0;
  dense_parameters *local_c8;
  basic_cstring<const_char> local_b0;
  undefined1 local_a0 [40];
  undefined1 local_78 [16];
  basic_cstring<const_char> local_68;
  basic_cstring<const_char> local_58;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  
  pdVar3 = (dense_parameters *)VW_InitializeA("-q st --noconstant --quiet");
  second_00 = (dense_parameters *)
              VW_ReadExampleA(pdVar3,"1 |s p^the_man w^the w^man |t p^un_homme w^un w^homme");
  local_20 = VW_InitializeA("-q st --noconstant --quiet");
  local_30 = VW_InitializeFeatureSpaces(2);
  local_38 = VW_GetFeatureSpace(local_30,0);
  VW_InitFeatures(local_38,3);
  local_40 = VW_SetFeatureSpace(local_20,local_38,"s");
  uVar1 = local_38;
  uVar4 = VW_HashFeatureA(local_20,"p^the_man",local_40);
  VW_SetFeature(0x3f800000,uVar1,0,uVar4);
  uVar1 = local_38;
  uVar4 = VW_HashFeatureA(local_20,"w^the",local_40);
  VW_SetFeature(0x3f800000,uVar1,1,uVar4);
  uVar1 = local_38;
  uVar4 = VW_HashFeatureA(local_20,"w^man",local_40);
  VW_SetFeature(0x3f800000,uVar1,2,uVar4);
  local_48 = VW_GetFeatureSpace(local_30,1);
  VW_InitFeatures(local_48,3);
  local_58.m_end = (iterator)VW_SetFeatureSpace(local_20,local_48,"t");
  uVar1 = local_48;
  uVar4 = VW_HashFeatureA(local_20,"p^un_homme",local_58.m_end);
  VW_SetFeature(0x3f800000,uVar1,0,uVar4);
  uVar1 = local_48;
  uVar4 = VW_HashFeatureA(local_20,"w^un",local_58.m_end);
  VW_SetFeature(0x3f800000,uVar1,1,uVar4);
  uVar1 = local_48;
  uVar4 = VW_HashFeatureA(local_20,"w^homme",local_58.m_end);
  VW_SetFeature(0x3f800000,uVar1,2,uVar4);
  local_28 = VW_ImportExample(local_20,"1",local_30,2);
  local_58.m_begin._4_4_ = VW_Learn(pdVar3,second_00);
  local_58.m_begin._0_4_ = VW_Learn(local_20,second_00);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/vwdll_test.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffe40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_68,0x3a,local_78);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe48,(char (*) [1])in_stack_fffffffffffffe40);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/vwdll_test.cc"
               ,0x6d);
    in_stack_fffffffffffffe48 = "score_constructed";
    in_stack_fffffffffffffe40 = &local_58;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,float,float>
              (local_a0,&local_b0,0x3a,1,2,(undefined1 *)((long)&local_58.m_begin + 4),
               "score_parsed");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1bd4a5);
    local_c8 = pdVar3;
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    pdVar3 = local_c8;
  } while (bVar2);
  local_d0 = local_20;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/vwdll_test.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffe40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e0,0x3e,local_f0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe48,(char (*) [1])in_stack_fffffffffffffe40);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/vwdll_test.cc"
               ,0x6d);
    in_stack_fffffffffffffe40 = (basic_cstring<const_char> *)(local_d0 + 0x3590);
    in_stack_fffffffffffffe48 = "vw2->weights.sparse";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_118,&local_128,0x3e,1,2,&local_c8[0x23b]._weight_mask,"vw1->weights.sparse");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1bd5d4);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  if ((local_c8[0x23b]._weight_mask & 1) == 0) {
    check_weights_equal<dense_parameters>(pdVar3,second_00);
  }
  else {
    check_weights_equal<sparse_parameters>(in_stack_00000020,in_stack_00000018);
  }
  VW_ReleaseFeatureSpace(local_30,2);
  VW_Finish(pdVar3);
  VW_Finish(local_20);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(vw_dll_parsed_and_constructed_example_parity)
{
  //parse example
  VW_HANDLE handle1 = VW_InitializeA("-q st --noconstant --quiet");
  VW_EXAMPLE example_parsed;
  example_parsed = VW_ReadExampleA(handle1, "1 |s p^the_man w^the w^man |t p^un_homme w^un w^homme");

  //construct example
  VW_HANDLE handle2 = VW_InitializeA("-q st --noconstant --quiet");
  VW_EXAMPLE example_constructed;
  auto fs = VW_InitializeFeatureSpaces(2);

  auto first = VW_GetFeatureSpace(fs, 0);
  VW_InitFeatures(first, 3);
  auto shash = VW_SetFeatureSpace(handle2, first, "s");
  VW_SetFeature(first, 0, VW_HashFeatureA(handle2, "p^the_man", shash), 1.0f);
  VW_SetFeature(first, 1, VW_HashFeatureA(handle2, "w^the", shash), 1.0f);
  VW_SetFeature(first, 2, VW_HashFeatureA(handle2, "w^man", shash), 1.0f);

  auto second = VW_GetFeatureSpace(fs, 1);
  VW_InitFeatures(second, 3);
  auto thash = VW_SetFeatureSpace(handle2, second, "t");
  VW_SetFeature(second, 0, VW_HashFeatureA(handle2, "p^un_homme", thash), 1.0f);
  VW_SetFeature(second, 1, VW_HashFeatureA(handle2, "w^un", thash), 1.0f);
  VW_SetFeature(second, 2, VW_HashFeatureA(handle2, "w^homme", thash), 1.0f);

  example_constructed = VW_ImportExample(handle2, "1", fs, 2);


  // learn both
  auto score_parsed = VW_Learn(handle1, example_parsed);
  auto score_constructed = VW_Learn(handle2, example_parsed);


  //check parity
  BOOST_CHECK_EQUAL(score_parsed, score_constructed);
  auto vw1 = static_cast<vw*>(handle1);
  auto vw2 = static_cast<vw*>(handle2);

  BOOST_CHECK_EQUAL(vw1->weights.sparse, vw2->weights.sparse);

  if (vw1->weights.sparse) {
    check_weights_equal(vw1->weights.sparse_weights, vw2->weights.sparse_weights);
  }
  else {
    check_weights_equal(vw1->weights.dense_weights, vw2->weights.dense_weights);
  }

  VW_ReleaseFeatureSpace(fs, 2);

  VW_Finish(handle1);
  VW_Finish(handle2);
}